

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  byte bVar1;
  stbi__uint32 sVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long in_FS_OFFSET;
  
  if (j->spec_end != 0) {
    *(char **)(in_FS_OFFSET + -0x10) = "can\'t merge dc and ac";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    iVar4 = j->code_bits;
    if (iVar4 < 1) {
      stbi__grow_buffer_unsafe(j);
      iVar4 = j->code_bits;
    }
    sVar2 = j->code_buffer;
    j->code_buffer = sVar2 * 2;
    j->code_bits = iVar4 + -1;
    if (-1 < (int)sVar2) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar7 = j->code_buffer;
  uVar5 = (ulong)hdc->fast[uVar7 >> 0x17];
  if (uVar5 == 0xff) {
    lVar10 = 0;
    do {
      lVar9 = lVar10;
      lVar10 = lVar9 + 1;
    } while (hdc->maxcode[lVar9 + 10] <= uVar7 >> 0x10);
    iVar4 = j->code_bits;
    if (lVar10 == 8) {
      iVar4 = iVar4 + -0x10;
      j->code_bits = iVar4;
    }
    else if ((int)(lVar9 + 10) <= iVar4) {
      uVar11 = uVar7 >> (0x17U - (char)lVar10 & 0x1f);
      uVar12 = stbi__bmask[lVar9 + 10];
      iVar3 = hdc->delta[lVar9 + 10];
      iVar6 = iVar4 - (int)lVar10;
      iVar4 = (iVar4 - (int)lVar10) + -9;
      j->code_bits = iVar6 + -9;
      uVar7 = uVar7 << ((byte)(lVar9 + 10) & 0x1f);
      j->code_buffer = uVar7;
      uVar5 = (ulong)(int)((uVar11 & uVar12) + iVar3);
      goto LAB_0014ce75;
    }
    uVar12 = 0xffffffff;
  }
  else {
    bVar1 = hdc->size[uVar5];
    iVar4 = j->code_bits;
    uVar12 = 0xffffffff;
    iVar3 = iVar4 - (uint)bVar1;
    if ((int)(uint)bVar1 <= iVar4) {
      uVar7 = uVar7 << (bVar1 & 0x1f);
      j->code_buffer = uVar7;
      j->code_bits = iVar3;
      iVar4 = iVar3;
LAB_0014ce75:
      uVar12 = (uint)hdc->values[uVar5];
      if (hdc->values[uVar5] == 0) {
        iVar4 = 0;
        goto LAB_0014cee1;
      }
    }
  }
  if (iVar4 < (int)uVar12) {
    stbi__grow_buffer_unsafe(j);
    uVar7 = j->code_buffer;
    iVar4 = j->code_bits;
  }
  bVar1 = (byte)uVar12 & 0x1f;
  uVar8 = uVar7 << bVar1 | uVar7 >> 0x20 - bVar1;
  uVar11 = stbi__bmask[(int)uVar12];
  j->code_buffer = ~uVar11 & uVar8;
  j->code_bits = iVar4 - uVar12;
  iVar4 = 0;
  if (-1 < (int)uVar7) {
    iVar4 = stbi__jbias[(int)uVar12];
  }
  iVar4 = iVar4 + (uVar8 & uVar11);
LAB_0014cee1:
  iVar4 = iVar4 + j->img_comp[b].dc_pred;
  j->img_comp[b].dc_pred = iVar4;
  *data = (short)(iVar4 << ((byte)j->succ_low & 0x1f));
  return 1;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc << j->succ_low);
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}